

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  long *plVar1;
  ostream *poVar2;
  long lVar3;
  initializer_list<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  __l;
  thread th_meteo;
  element_type *in_stack_ffffffffffc9c198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffc9c1a0;
  topic_ptr_t<std::__cxx11::basic_string<char>_*> meteo_b;
  topic_ptr_t<std::__cxx11::basic_string<char>_*> meteo_a;
  shared_ptr<publisher_t> meteo_station;
  shared_ptr<publisher_t> meteo_b_station;
  shared_ptr<publisher_t> meteo_a_station;
  global_sub global;
  
  std::__cxx11::string::string((string *)&global,"meteo-a",(allocator *)&stack0xffffffffffc9c198);
  std::make_shared<ps::Topic<std::__cxx11::string*>,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meteo_a);
  std::__cxx11::string::~string((string *)&global);
  std::
  __shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                  *)&stack0xffffffffffc9c218,
                 &meteo_a.
                  super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                );
  std::make_shared<publisher_t,std::shared_ptr<ps::Topic<std::__cxx11::string*>>&>
            ((shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              *)&meteo_a_station);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffc9c220);
  std::__cxx11::string::string((string *)&stack0xffffffffffc9c258,"A",(allocator *)&global);
  std::__cxx11::string::operator=
            ((string *)
             &(meteo_a_station.super___shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              name,(string *)&stack0xffffffffffc9c258);
  std::__cxx11::string::~string((string *)&stack0xffffffffffc9c258);
  std::__cxx11::string::string((string *)&global,"meteo-b",(allocator *)&stack0xffffffffffc9c198);
  std::make_shared<ps::Topic<std::__cxx11::string*>,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meteo_b);
  std::__cxx11::string::~string((string *)&global);
  std::
  __shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                  *)&stack0xffffffffffc9c1f8,
                 &meteo_b.
                  super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                );
  std::make_shared<publisher_t,std::shared_ptr<ps::Topic<std::__cxx11::string*>>&>
            ((shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              *)&meteo_b_station);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffc9c200);
  std::__cxx11::string::string((string *)&stack0xffffffffffc9c238,"B",(allocator *)&global);
  std::__cxx11::string::operator=
            ((string *)
             &(meteo_b_station.super___shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              name,(string *)&stack0xffffffffffc9c238);
  std::__cxx11::string::~string((string *)&stack0xffffffffffc9c238);
  std::
  __shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                  *)&global,
                 &meteo_a.
                  super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                );
  std::
  __shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                  *)&global.
                     super_Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                     .m,&meteo_b.
                         super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                );
  __l._M_len = 2;
  __l._M_array = (iterator)&global;
  std::
  vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ::vector((vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
            *)&stack0xffffffffffc9c198,__l,(allocator_type *)&stack0xffffffffffc9c1d8);
  std::
  make_shared<publisher_t,std::vector<std::shared_ptr<ps::Topic<std::__cxx11::string*>>,std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::string*>>>>const&>
            ((vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
              *)&meteo_station);
  std::
  vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ::~vector((vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
             *)&stack0xffffffffffc9c198);
  lVar3 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (global.
                super_Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                .data.padding1 + lVar3 + -0x3c));
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != -8);
  global_sub::global_sub(&global);
  std::
  __shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                  *)&stack0xffffffffffc9c198,
                 &meteo_a.
                  super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                );
  std::
  __shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                  *)&stack0xffffffffffc9c1a8,
                 &meteo_b.
                  super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                );
  ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::subscribe(&global.
               super_Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              ,(initializer_list<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                *)&stack0xffffffffffc9c1d8);
  lVar3 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&stack0xffffffffffc9c198 + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != -8);
  ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::run(&global.
         super_Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
       );
  std::__shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffc9c198,
             &meteo_station.super___shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2>);
  th_meteo._M_id._M_thread = (id)0;
  plVar1 = (long *)operator_new(0x18);
  *plVar1 = (long)&PTR___State_impl_0010cd78;
  *(int *)(plVar1 + 1) = (int)in_stack_ffffffffffc9c198;
  *(int *)((long)plVar1 + 0xc) = (int)((ulong)in_stack_ffffffffffc9c198 >> 0x20);
  *(int *)(plVar1 + 2) = (int)in_stack_ffffffffffc9c1a0._M_pi;
  *(int *)((long)plVar1 + 0x14) = (int)((ulong)in_stack_ffffffffffc9c1a0._M_pi >> 0x20);
  std::thread::_M_start_thread(&th_meteo,&stack0xffffffffffc9c1d8,0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffc9c1a0);
  std::thread::join();
  ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::stop_wait(&global.
               super_Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             );
  poVar2 = std::operator<<((ostream *)&std::cout,"g_counter: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::thread::~thread(&th_meteo);
  global_sub::~global_sub(&global);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&meteo_station.super___shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&meteo_b_station.super___shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&meteo_b.
              super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&meteo_a_station.super___shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&meteo_a.
              super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return 0;
}

Assistant:

int main()
{
	auto meteo_a = create_topic<std::string*>("meteo-a");
	auto meteo_a_station = create_publisher<std::string*, publisher_t>(meteo_a);
	meteo_a_station->set_name("A");

	auto meteo_b = create_topic<std::string*>("meteo-b");
	auto meteo_b_station = create_publisher<std::string*, publisher_t>(meteo_b);
	meteo_b_station->set_name("B");

	auto meteo_station = create_publisher<std::string*, publisher_t>(std::vector<topic_ptr_t<std::string*>>{meteo_a, meteo_b});

	global_sub global;
	global.subscribe({meteo_a, meteo_b});

	global.counter = 0;
	global.run();

	std::thread th_meteo([=]{
		std::vector<std::string> cities{"Rome", "Florence", "Venice"};

		for (uint32_t i = 0; i < 1000000; i++)
		{
			const std::string tcelsius_a = std::to_string(24 + (i % 10));
			//const std::string tcelsius_b = std::to_string(34 + (i % 19));
			meteo_station->produce(push_data(cities[i%3] + ", " + tcelsius_a));
			//meteo_b_station->produce(push_data(cities[i%3] + ", " + tcelsius_b));
		}
	});

	th_meteo.join();
	global.stop_wait();

	std::cout << "g_counter: " << global.counter << std::endl;

	return 0;
}